

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

decimal_fp<double> fmt::v11::detail::dragonbox::shorter_interval_case<double>(int exponent)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  char cVar6;
  uint128_fallback uVar7;
  decimal_fp<double> dVar8;
  ulong local_30;
  int local_28;
  
  iVar1 = floor_log10_pow2_minus_log10_4_over_3(exponent);
  iVar2 = floor_log2_pow10(-iVar1);
  cVar6 = (char)iVar2 + (char)exponent;
  uVar7 = cache_accessor<double>::get_cached_power(-iVar1);
  uVar4 = uVar7.hi_;
  bVar3 = 0xb - cVar6;
  uVar5 = (ulong)((exponent & 0xfffffffeU) != 2) + (uVar4 - (uVar4 >> 0x36) >> (bVar3 & 0x3f));
  local_30 = ((uVar4 >> 0x35) + uVar4 >> (bVar3 & 0x3f)) / 10;
  if (local_30 * 10 < uVar5) {
    local_30 = (uVar4 >> (10U - cVar6 & 0x3f)) + 1 >> 1;
    if (exponent == -0x4d) {
      local_30 = local_30 & 0xfffffffffffffffe;
    }
    else {
      local_30 = local_30 + (local_30 < uVar5);
    }
  }
  else {
    local_28 = iVar1 + 1;
    iVar1 = remove_trailing_zeros(&local_30);
    iVar1 = iVar1 + local_28;
  }
  dVar8.exponent = iVar1;
  dVar8.significand = local_30;
  dVar8._12_4_ = 0;
  return dVar8;
}

Assistant:

FMT_INLINE decimal_fp<T> shorter_interval_case(int exponent) noexcept {
  decimal_fp<T> ret_value;
  // Compute k and beta
  const int minus_k = floor_log10_pow2_minus_log10_4_over_3(exponent);
  const int beta = exponent + floor_log2_pow10(-minus_k);

  // Compute xi and zi
  using cache_entry_type = typename cache_accessor<T>::cache_entry_type;
  const cache_entry_type cache = cache_accessor<T>::get_cached_power(-minus_k);

  auto xi = cache_accessor<T>::compute_left_endpoint_for_shorter_interval_case(
      cache, beta);
  auto zi = cache_accessor<T>::compute_right_endpoint_for_shorter_interval_case(
      cache, beta);

  // If the left endpoint is not an integer, increase it
  if (!is_left_endpoint_integer_shorter_interval<T>(exponent)) ++xi;

  // Try bigger divisor
  ret_value.significand = zi / 10;

  // If succeed, remove trailing zeros if necessary and return
  if (ret_value.significand * 10 >= xi) {
    ret_value.exponent = minus_k + 1;
    ret_value.exponent += remove_trailing_zeros(ret_value.significand);
    return ret_value;
  }

  // Otherwise, compute the round-up of y
  ret_value.significand =
      cache_accessor<T>::compute_round_up_for_shorter_interval_case(cache,
                                                                    beta);
  ret_value.exponent = minus_k;

  // When tie occurs, choose one of them according to the rule
  if (exponent >= float_info<T>::shorter_interval_tie_lower_threshold &&
      exponent <= float_info<T>::shorter_interval_tie_upper_threshold) {
    ret_value.significand = ret_value.significand % 2 == 0
                                ? ret_value.significand
                                : ret_value.significand - 1;
  } else if (ret_value.significand < xi) {
    ++ret_value.significand;
  }
  return ret_value;
}